

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

void __thiscall
gl4cts::GLSL420Pack::BindingSamplerAPIOverrideTest::prepareUniforms
          (BindingSamplerAPIOverrideTest *this,program *program)

{
  int iVar1;
  GLint GVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TestError *this_00;
  socklen_t __len;
  ulong uVar5;
  sockaddr *__addr;
  texture *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> texture_data;
  GLint binding;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  int local_2c;
  long lVar4;
  
  iVar1 = (*((this->super_GLSLTestBase).super_TestBase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  GVar2 = Utils::program::getUniformLocation(program,"goku");
  (**(code **)(lVar4 + 0x14f0))(GVar2,0xb);
  local_2c = -1;
  (**(code **)(lVar4 + 0xb68))(program->m_program_object_id,GVar2,&local_2c);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"getUniformiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x2c16);
  if (local_2c == 0xb) {
    this_01 = &this->m_goku_texture;
    Utils::texture::create(this_01,0x10,0x10,0x8058);
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_48,0x100);
    if ((long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      uVar5 = 0;
      do {
        local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar5] = 0xff;
        uVar5 = uVar5 + 1;
      } while ((uVar5 & 0xffffffff) <
               (ulong)((long)local_48.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)local_48.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start >> 2));
    }
    Utils::texture::update
              (this_01,0x10,0x10,0,0x1908,0x1401,
               local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
    (**(code **)(lVar4 + 8))(0x84cb);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    iVar1 = 0x1aac7e6;
    __len = 0x2c2b;
    glu::checkError(dVar3,"ActiveTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                    ,0x2c2b);
    Utils::texture::bind(this_01,iVar1,__addr,__len);
    if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Wrong binding value",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
             ,0x2c1a);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BindingSamplerAPIOverrideTest::prepareUniforms(Utils::program& program)
{
	static const GLuint goku_data   = 0x000000ff;
	static const GLint  new_binding = 11;

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	const GLint uniform_location = program.getUniformLocation("goku");
	if (-1 == uniform_location)
	{
		TCU_FAIL("Uniform is inactive");
	}

	gl.uniform1i(uniform_location, new_binding);

	GLint binding = -1;

	gl.getUniformiv(program.m_program_object_id, uniform_location, &binding);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getUniformiv");

	if (new_binding != binding)
	{
		TCU_FAIL("Wrong binding value");
		return;
	}

	m_goku_texture.create(16, 16, GL_RGBA8);

	std::vector<GLuint> texture_data;
	texture_data.resize(16 * 16);

	for (GLuint i = 0; i < texture_data.size(); ++i)
	{
		texture_data[i] = goku_data;
	}

	m_goku_texture.update(16, 16, 0 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, &texture_data[0]);

	gl.activeTexture(GL_TEXTURE11);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ActiveTexture");

	m_goku_texture.bind();
}